

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall LLVMBC::UnaryOperator::UnaryOperator(UnaryOperator *this,UnaryOps uop,Value *value)

{
  pointer ptr;
  Type *type_;
  pointer ppVVar1;
  
  type_ = Value::getType(value);
  Value::Value((Value *)this,type_,UnaryOperator);
  (this->super_Instruction).is_terminator = false;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Instruction).attachments._M_h._M_buckets =
       &(this->super_Instruction).attachments._M_h._M_single_bucket;
  (this->super_Instruction).attachments._M_h._M_bucket_count = 1;
  (this->super_Instruction).attachments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_Instruction).attachments._M_h._M_element_count = 0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Instruction).attachments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ppVVar1 = (pointer)::dxil_spv::allocate_in_thread(8);
  *ppVVar1 = value;
  ptr = (this->super_Instruction).operands.
        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppVVar1;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar1 + 1;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppVVar1 + 1;
  if (ptr != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr);
    return;
  }
  return;
}

Assistant:

UnaryOperator::UnaryOperator(UnaryOps uop, Value *value)
    : Instruction(value->getType(), ValueKind::UnaryOperator)
{
	set_operands({ value });
}